

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Point>::Inserter::insertOne(Inserter *this,qsizetype pos,Point *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Point *pPVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Point *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pPVar3 = this->begin;
  lVar11 = this->size;
  pPVar7 = pPVar3 + lVar11;
  this->end = pPVar7;
  this->last = pPVar3 + lVar11 + -1;
  this->where = pPVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct != 0) {
    pDVar4 = (t->name).d.d;
    (t->name).d.d = (Data *)0x0;
    (pPVar7->name).d.d = pDVar4;
    pcVar5 = (t->name).d.ptr;
    (t->name).d.ptr = (char16_t *)0x0;
    (pPVar7->name).d.ptr = pcVar5;
    qVar6 = (t->name).d.size;
    (t->name).d.size = 0;
    (pPVar7->name).d.size = qVar6;
    pDVar4 = (t->parameters).d.d;
    (t->parameters).d.d = (Data *)0x0;
    (pPVar7->parameters).d.d = pDVar4;
    pcVar5 = (t->parameters).d.ptr;
    (t->parameters).d.ptr = (char16_t *)0x0;
    (pPVar7->parameters).d.ptr = pcVar5;
    qVar6 = (t->parameters).d.size;
    (t->parameters).d.size = 0;
    (pPVar7->parameters).d.size = qVar6;
    this->size = this->size + 1;
    return;
  }
  pDVar4 = pPVar7[-1].name.d.d;
  pcVar5 = pPVar7[-1].name.d.ptr;
  pPVar7[-1].name.d.d = (Data *)0x0;
  pPVar7[-1].name.d.ptr = (char16_t *)0x0;
  (pPVar7->name).d.d = pDVar4;
  (pPVar7->name).d.ptr = pcVar5;
  qVar6 = pPVar7[-1].name.d.size;
  pPVar7[-1].name.d.size = 0;
  (pPVar7->name).d.size = qVar6;
  pDVar4 = pPVar7[-1].parameters.d.d;
  pcVar5 = pPVar7[-1].parameters.d.ptr;
  pPVar7[-1].parameters.d.d = (Data *)0x0;
  pPVar7[-1].parameters.d.ptr = (char16_t *)0x0;
  (pPVar7->parameters).d.d = pDVar4;
  (pPVar7->parameters).d.ptr = pcVar5;
  qVar6 = pPVar7[-1].parameters.d.size;
  pPVar7[-1].parameters.d.size = 0;
  (pPVar7->parameters).d.size = qVar6;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      pPVar7 = this->last;
      puVar2 = (undefined8 *)((long)&(pPVar7->name).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pPVar7[-1].name.d.d + lVar11);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar7->name).d.d + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar2 = (undefined8 *)((long)&pPVar7[-1].name.d.d + lVar11);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pPVar7->name).d.size + lVar11);
      *(undefined8 *)((long)&(pPVar7->name).d.size + lVar11) =
           *(undefined8 *)((long)pPVar7 + lVar11 + -0x20);
      *(undefined8 *)((long)pPVar7 + lVar11 + -0x20) = uVar8;
      puVar2 = (undefined8 *)((long)&(pPVar7->parameters).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)pPVar7 + lVar11 + -0x18);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)&(pPVar7->parameters).d.d + lVar11);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      puVar2 = (undefined8 *)((long)pPVar7 + lVar11 + -0x18);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pPVar7->parameters).d.size + lVar11);
      *(undefined8 *)((long)&(pPVar7->parameters).d.size + lVar11) =
           *(undefined8 *)((long)pPVar7 + lVar11 + -8);
      *(undefined8 *)((long)pPVar7 + lVar11 + -8) = uVar8;
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x30;
    } while (lVar12 != this->move);
  }
  pPVar7 = this->where;
  pDVar4 = (pPVar7->name).d.d;
  (pPVar7->name).d.d = (t->name).d.d;
  (t->name).d.d = pDVar4;
  pcVar5 = (pPVar7->name).d.ptr;
  (pPVar7->name).d.ptr = (t->name).d.ptr;
  (t->name).d.ptr = pcVar5;
  qVar6 = (pPVar7->name).d.size;
  (pPVar7->name).d.size = (t->name).d.size;
  (t->name).d.size = qVar6;
  pDVar4 = (pPVar7->parameters).d.d;
  (pPVar7->parameters).d.d = (t->parameters).d.d;
  (t->parameters).d.d = pDVar4;
  pcVar5 = (pPVar7->parameters).d.ptr;
  (pPVar7->parameters).d.ptr = (t->parameters).d.ptr;
  (t->parameters).d.ptr = pcVar5;
  qVar6 = (pPVar7->parameters).d.size;
  (pPVar7->parameters).d.size = (t->parameters).d.size;
  (t->parameters).d.size = qVar6;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }